

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

void libcellml::updateComponentsVariablesUnitsNames
               (string *name,ComponentPtr *component,UnitsPtr *units)

{
  _Alloc_hider _Var1;
  undefined8 uVar2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> units_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  _func_int **name_00;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  ulong uVar7;
  ComponentPtr childComponent;
  ModelPtr importModel;
  ComponentPtr importComponent;
  string local_a8;
  undefined1 local_88 [32];
  element_type *local_68;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_60;
  Variable *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  ComponentEntity local_40;
  
  local_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)units;
  sVar6 = Component::variableCount
                    ((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  if (sVar6 != 0) {
    uVar7 = 0;
    do {
      Component::variable((Component *)local_88,
                          (size_t)(component->
                                  super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr);
      bVar4 = ImportedEntity::isImport
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ImportedEntity);
      if (bVar4) {
        ImportedEntity::importSource
                  (&((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    super_ImportedEntity);
        ImportSource::model((ImportSource *)(local_88 + 0x18));
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
        }
        uVar2 = local_88._24_8_;
        ImportedEntity::importReference_abi_cxx11_
                  (&local_a8,
                   &((component->
                     super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    super_ImportedEntity);
        ComponentEntity::component(&local_40,(string *)uVar2,SUB81(&local_a8,0));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        name_00 = local_40.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity;
        NamedEntity::name_abi_cxx11_(&local_a8,(NamedEntity *)local_88._0_8_);
        Component::variable((Component *)&local_58,(string *)name_00);
        p_Var3 = p_Stack_50;
        local_88._0_8_ = local_58;
        uVar2 = local_88._8_8_;
        local_58 = (Variable *)0x0;
        p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_88._8_8_ = p_Var3;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2);
          if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if ((element_type *)local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
        }
        if (local_68 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
        }
      }
      Variable::units((Variable *)local_88._0_8_);
      NamedEntity::name_abi_cxx11_(&local_a8,(NamedEntity *)local_88._24_8_);
      _Var1._M_p = local_a8._M_dataplus._M_p;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)name->_M_string_length) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar4 = true;
        }
        else {
          iVar5 = bcmp(local_a8._M_dataplus._M_p,(name->_M_dataplus)._M_p,local_a8._M_string_length)
          ;
          bVar4 = iVar5 == 0;
        }
      }
      else {
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var1._M_p != &local_a8.field_2) {
        operator_delete(_Var1._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if (local_68 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
      }
      if (bVar4) {
        Variable::setUnits((Variable *)local_88._0_8_,(UnitsPtr *)local_60._M_pi);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      uVar7 = uVar7 + 1;
      sVar6 = Component::variableCount
                        ((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
    } while (uVar7 < sVar6);
  }
  sVar6 = ComponentEntity::componentCount
                    (&((component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                      ->super_ComponentEntity);
  units_00._M_pi = local_60._M_pi;
  if (sVar6 != 0) {
    uVar7 = 0;
    do {
      ComponentEntity::component
                ((ComponentEntity *)&local_a8,
                 (size_t)(component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr);
      updateComponentsVariablesUnitsNames(name,(ComponentPtr *)&local_a8,(UnitsPtr *)units_00._M_pi)
      ;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
      }
      uVar7 = uVar7 + 1;
      sVar6 = ComponentEntity::componentCount
                        (&((component->
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->super_ComponentEntity);
    } while (uVar7 < sVar6);
  }
  return;
}

Assistant:

void updateComponentsVariablesUnitsNames(const std::string &name, const ComponentPtr &component, const UnitsPtr &units)
{
    for (size_t variableIndex = 0; variableIndex < component->variableCount(); ++variableIndex) {
        auto variable = component->variable(variableIndex);
        if (component->isImport()) {
            auto importModel = component->importSource()->model();
            auto importComponent = importModel->component(component->importReference());
            variable = importComponent->variable(variable->name());
        }
        if (variable->units()->name() == name) {
            variable->setUnits(units);
        }
    }
    for (size_t index = 0; index < component->componentCount(); ++index) {
        auto childComponent = component->component(index);
        updateComponentsVariablesUnitsNames(name, childComponent, units);
    }
}